

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int param_7)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  undefined2 uVar5;
  undefined8 uVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  stbi__uint32 sVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  stbi__jpeg *psVar15;
  undefined7 extraout_var;
  long lVar16;
  ulong uVar17;
  void *pvVar18;
  code *pcVar19;
  stbi__uint32 sVar20;
  int iVar21;
  anon_struct_96_18_0d0905d3 *paVar22;
  ushort *puVar23;
  long lVar24;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar28;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  uint7 uVar30;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *psVar29;
  ulong uVar31;
  ulong uVar32;
  undefined1 *puVar33;
  byte *pbVar34;
  uint uVar35;
  anon_struct_96_18_0d0905d3 *paVar36;
  short *psVar37;
  ushort *puVar38;
  stbi_uc *psVar39;
  long lVar40;
  byte *pbVar41;
  int iVar42;
  int iVar43;
  stbi__context *psVar44;
  int *piVar45;
  short sVar46;
  uint uVar47;
  int *piVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  stbi_uc *coutput [4];
  short data [64];
  stbi_uc *local_1a0;
  stbi_uc *local_158 [5];
  int local_130;
  int local_12c;
  int *local_128;
  anon_struct_96_18_0d0905d3 *local_120;
  stbi__uint32 *local_118;
  stbi__uint32 *local_110;
  int *local_108;
  long local_100;
  stbi__png local_f8;
  int local_d0 [40];
  
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  local_118 = (stbi__uint32 *)x;
  local_110 = (stbi__uint32 *)y;
  local_108 = comp;
  psVar15 = (stbi__jpeg *)malloc(0x4888);
  psVar15->s = s;
  psVar15->idct_block_kernel = stbi__idct_simd;
  psVar15->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar15->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar15->jfif = 0;
  psVar15->app14_color_transform = -1;
  psVar15->marker = 0xff;
  sVar7 = stbi__get_marker(psVar15);
  paVar22 = (anon_struct_96_18_0d0905d3 *)(CONCAT71(extraout_var,sVar7) & 0xffffffff);
  if (sVar7 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar15);
  if ((char)paVar22 == -0x28) {
    psVar15 = (stbi__jpeg *)malloc(0x4888);
    psVar15->s = s;
    psVar15->idct_block_kernel = stbi__idct_simd;
    psVar15->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar15->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar15->img_comp;
      lVar16 = 0x46d8;
      do {
        psVar29 = psVar15->huff_dc[0].fast + lVar16 + -8;
        psVar29[0] = '\0';
        psVar29[1] = '\0';
        psVar29[2] = '\0';
        psVar29[3] = '\0';
        psVar29[4] = '\0';
        psVar29[5] = '\0';
        psVar29[6] = '\0';
        psVar29[7] = '\0';
        psVar29[8] = '\0';
        psVar29[9] = '\0';
        psVar29[10] = '\0';
        psVar29[0xb] = '\0';
        psVar29[0xc] = '\0';
        psVar29[0xd] = '\0';
        psVar29[0xe] = '\0';
        psVar29[0xf] = '\0';
        lVar16 = lVar16 + 0x60;
      } while (lVar16 != 0x4858);
      psVar15->restart_interval = 0;
      iVar9 = stbi__decode_jpeg_header(psVar15,0);
      uVar47 = extraout_EDX;
      if (iVar9 != 0) {
        bVar8 = stbi__get_marker(psVar15);
        local_128 = psVar15->huff_ac[0].delta + 9;
LAB_00102c5e:
        if (bVar8 == 0xda) {
          iVar9 = stbi__get16be(psVar15->s);
          psVar44 = psVar15->s;
          pbVar34 = psVar44->img_buffer;
          paVar28 = extraout_RDX_00;
          if (pbVar34 < psVar44->img_buffer_end) {
LAB_00102d51:
            psVar44->img_buffer = pbVar34 + 1;
            bVar8 = *pbVar34;
          }
          else {
            if (psVar44->read_from_callbacks != 0) {
              psVar29 = psVar44->buffer_start;
              iVar43 = (*(psVar44->io).read)(psVar44->io_user_data,(char *)psVar29,psVar44->buflen);
              if (iVar43 == 0) {
                psVar44->read_from_callbacks = 0;
                psVar44->img_buffer = psVar29;
                psVar44->img_buffer_end = psVar44->buffer_start + 1;
                psVar44->buffer_start[0] = '\0';
              }
              else {
                psVar44->img_buffer = psVar29;
                psVar44->img_buffer_end = psVar29 + iVar43;
              }
              pbVar34 = psVar44->img_buffer;
              paVar28 = extraout_RDX_01;
              goto LAB_00102d51;
            }
            bVar8 = 0;
          }
          psVar15->scan_n = (uint)bVar8;
          if ((0xfb < (byte)(bVar8 - 5)) && ((int)(uint)bVar8 <= psVar15->s->img_n)) {
            if (iVar9 != (uint)bVar8 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_00105392;
            }
            if (bVar8 != 0) {
              lVar16 = 0;
              do {
                psVar44 = psVar15->s;
                pbVar34 = psVar44->img_buffer;
                if (pbVar34 < psVar44->img_buffer_end) {
LAB_00102e0e:
                  psVar44->img_buffer = pbVar34 + 1;
                  paVar22 = (anon_struct_96_18_0d0905d3 *)(ulong)*pbVar34;
                }
                else {
                  if (psVar44->read_from_callbacks != 0) {
                    psVar29 = psVar44->buffer_start;
                    iVar9 = (*(psVar44->io).read)
                                      (psVar44->io_user_data,(char *)psVar29,psVar44->buflen);
                    if (iVar9 == 0) {
                      psVar44->read_from_callbacks = 0;
                      psVar44->img_buffer = psVar29;
                      psVar44->img_buffer_end = psVar44->buffer_start + 1;
                      psVar44->buffer_start[0] = '\0';
                    }
                    else {
                      psVar44->img_buffer = psVar29;
                      psVar44->img_buffer_end = psVar29 + iVar9;
                    }
                    pbVar34 = psVar44->img_buffer;
                    goto LAB_00102e0e;
                  }
                  paVar22 = (anon_struct_96_18_0d0905d3 *)0x0;
                }
                psVar44 = psVar15->s;
                pbVar34 = psVar44->img_buffer;
                if (pbVar34 < psVar44->img_buffer_end) {
LAB_00102e91:
                  psVar44->img_buffer = pbVar34 + 1;
                  bVar8 = *pbVar34;
                }
                else {
                  if (psVar44->read_from_callbacks != 0) {
                    psVar29 = psVar44->buffer_start;
                    iVar9 = (*(psVar44->io).read)
                                      (psVar44->io_user_data,(char *)psVar29,psVar44->buflen);
                    if (iVar9 == 0) {
                      psVar44->read_from_callbacks = 0;
                      psVar44->img_buffer = psVar29;
                      psVar44->img_buffer_end = psVar44->buffer_start + 1;
                      psVar44->buffer_start[0] = '\0';
                    }
                    else {
                      psVar44->img_buffer = psVar29;
                      psVar44->img_buffer_end = psVar29 + iVar9;
                    }
                    pbVar34 = psVar44->img_buffer;
                    goto LAB_00102e91;
                  }
                  bVar8 = 0;
                }
                uVar47 = psVar15->s->img_n;
                if ((int)uVar47 < 1) {
                  uVar32 = 0;
                }
                else {
                  uVar32 = 0;
                  paVar28 = paVar1;
                  do {
                    if (paVar28->id == (int)paVar22) goto LAB_00102ec3;
                    uVar32 = uVar32 + 1;
                    paVar28 = paVar28 + 1;
                  } while (uVar47 != uVar32);
                  uVar32 = (ulong)uVar47;
                }
LAB_00102ec3:
                if ((uint)uVar32 == uVar47) goto LAB_00105399;
                uVar31 = uVar32 & 0xffffffff;
                paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar31 * 0x60);
                psVar15->img_comp[uVar31].hd = (uint)(bVar8 >> 4);
                if (0x3f < bVar8) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_00105392;
                }
                paVar28 = paVar1 + uVar31;
                paVar28->ha = bVar8 & 0xf;
                if (3 < (bVar8 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_00105392;
                }
                psVar15->order[lVar16] = (uint)uVar32;
                lVar16 = lVar16 + 1;
              } while (lVar16 < psVar15->scan_n);
            }
            psVar44 = psVar15->s;
            pbVar34 = psVar44->img_buffer;
            if (pbVar34 < psVar44->img_buffer_end) {
LAB_00102f8d:
              psVar44->img_buffer = pbVar34 + 1;
              uVar47 = (uint)*pbVar34;
            }
            else {
              if (psVar44->read_from_callbacks != 0) {
                psVar29 = psVar44->buffer_start;
                iVar9 = (*(psVar44->io).read)(psVar44->io_user_data,(char *)psVar29,psVar44->buflen)
                ;
                if (iVar9 == 0) {
                  psVar44->read_from_callbacks = 0;
                  psVar44->img_buffer = psVar29;
                  psVar44->img_buffer_end = psVar44->buffer_start + 1;
                  psVar44->buffer_start[0] = '\0';
                }
                else {
                  psVar44->img_buffer = psVar29;
                  psVar44->img_buffer_end = psVar29 + iVar9;
                }
                pbVar34 = psVar44->img_buffer;
                goto LAB_00102f8d;
              }
              uVar47 = 0;
            }
            psVar15->spec_start = uVar47;
            psVar44 = psVar15->s;
            pbVar34 = psVar44->img_buffer;
            if (pbVar34 < psVar44->img_buffer_end) {
LAB_00103016:
              psVar44->img_buffer = pbVar34 + 1;
              uVar47 = (uint)*pbVar34;
            }
            else {
              if (psVar44->read_from_callbacks != 0) {
                psVar29 = psVar44->buffer_start;
                iVar9 = (*(psVar44->io).read)(psVar44->io_user_data,(char *)psVar29,psVar44->buflen)
                ;
                if (iVar9 == 0) {
                  psVar44->read_from_callbacks = 0;
                  psVar44->img_buffer = psVar29;
                  psVar44->img_buffer_end = psVar44->buffer_start + 1;
                  psVar44->buffer_start[0] = '\0';
                }
                else {
                  psVar44->img_buffer = psVar29;
                  psVar44->img_buffer_end = psVar29 + iVar9;
                }
                pbVar34 = psVar44->img_buffer;
                goto LAB_00103016;
              }
              uVar47 = 0;
            }
            psVar15->spec_end = uVar47;
            psVar44 = psVar15->s;
            pbVar34 = psVar44->img_buffer;
            if (pbVar34 < psVar44->img_buffer_end) {
LAB_0010309f:
              psVar44->img_buffer = pbVar34 + 1;
              bVar8 = *pbVar34;
            }
            else {
              if (psVar44->read_from_callbacks != 0) {
                psVar29 = psVar44->buffer_start;
                iVar9 = (*(psVar44->io).read)(psVar44->io_user_data,(char *)psVar29,psVar44->buflen)
                ;
                if (iVar9 == 0) {
                  psVar44->read_from_callbacks = 0;
                  psVar44->img_buffer = psVar29;
                  psVar44->img_buffer_end = psVar44->buffer_start + 1;
                  psVar44->buffer_start[0] = '\0';
                }
                else {
                  psVar44->img_buffer = psVar29;
                  psVar44->img_buffer_end = psVar29 + iVar9;
                }
                pbVar34 = psVar44->img_buffer;
                goto LAB_0010309f;
              }
              bVar8 = 0;
            }
            psVar15->succ_high = (uint)(bVar8 >> 4);
            uVar47 = bVar8 & 0xf;
            paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar47;
            psVar15->succ_low = uVar47;
            iVar9 = psVar15->progressive;
            iVar43 = psVar15->spec_start;
            if (iVar9 == 0) {
              if ((iVar43 != 0) || ((0xf < bVar8 || ((bVar8 & 0xf) != 0)))) {
LAB_00104a61:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_00105392;
              }
              psVar15->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar43) || (0x3f < psVar15->spec_end)) ||
                     (psVar15->spec_end < iVar43)) || ((0xdf < bVar8 || (0xd < uVar47))))
            goto LAB_00104a61;
            iVar43 = psVar15->scan_n;
            uVar32 = (ulong)(uint)psVar15->restart_interval;
            if (psVar15->restart_interval == 0) {
              uVar32 = 0x7fffffff;
            }
            psVar15->code_buffer = 0;
            psVar15->code_bits = 0;
            psVar15->nomore = 0;
            psVar15->img_comp[3].dc_pred = 0;
            psVar15->img_comp[2].dc_pred = 0;
            psVar15->img_comp[1].dc_pred = 0;
            psVar15->img_comp[0].dc_pred = 0;
            psVar15->marker = 0xff;
            uVar47 = (uint)uVar32;
            psVar15->todo = uVar47;
            psVar15->eob_run = 0;
            if (iVar9 == 0) {
              if (iVar43 == 1) {
                iVar43 = psVar15->order[0];
                iVar21 = psVar15->img_comp[iVar43].y + 7 >> 3;
                iVar9 = 1;
                if (0 < iVar21) {
                  uVar35 = paVar1[iVar43].x + 7 >> 3;
                  iVar12 = 0;
                  iVar14 = 0;
                  do {
                    if (0 < (int)uVar35) {
                      paVar22 = (anon_struct_96_18_0d0905d3 *)0x0;
                      do {
                        iVar9 = stbi__jpeg_decode_block
                                          (psVar15,(short *)&local_f8,
                                           (stbi__huffman *)psVar15->huff_dc[paVar1[iVar43].hd].fast
                                           ,(stbi__huffman *)
                                            psVar15->huff_ac[paVar1[iVar43].ha].fast,
                                           psVar15->fast_ac[paVar1[iVar43].ha],iVar43,
                                           psVar15->dequant[paVar1[iVar43].tq]);
                        if (iVar9 == 0) {
                          bVar49 = false;
                          local_1a0 = (stbi_uc *)0x0;
                          uVar32 = extraout_RDX_07;
                        }
                        else {
                          (*psVar15->idct_block_kernel)
                                    (paVar1[iVar43].data + iVar12 * paVar1[iVar43].w2 +
                                     (long)paVar22,paVar1[iVar43].w2,(short *)&local_f8);
                          iVar9 = psVar15->todo;
                          psVar15->todo = iVar9 + -1;
                          bVar49 = true;
                          uVar32 = extraout_RDX_08;
                          if (iVar9 < 2) {
                            if (psVar15->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar15);
                              uVar32 = extraout_RDX_09;
                            }
                            if ((psVar15->marker & 0xf8) == 0xd0) {
                              psVar15->code_buffer = 0;
                              psVar15->code_bits = 0;
                              psVar15->nomore = 0;
                              psVar15->img_comp[3].dc_pred = 0;
                              psVar15->img_comp[2].dc_pred = 0;
                              psVar15->img_comp[1].dc_pred = 0;
                              psVar15->img_comp[0].dc_pred = 0;
                              psVar15->marker = 0xff;
                              iVar9 = psVar15->restart_interval;
                              uVar32 = 0x7fffffff;
                              if (iVar9 == 0) {
                                iVar9 = 0x7fffffff;
                              }
                              psVar15->todo = iVar9;
                              psVar15->eob_run = 0;
                            }
                            else {
                              local_1a0 = (stbi_uc *)0x1;
                              bVar49 = false;
                            }
                          }
                        }
                        uVar47 = (uint)uVar32;
                        if (!bVar49) {
                          iVar9 = (int)local_1a0;
                          goto LAB_00104032;
                        }
                        paVar22 = (anon_struct_96_18_0d0905d3 *)&paVar22->v;
                      } while ((anon_struct_96_18_0d0905d3 *)((ulong)uVar35 * 8) != paVar22);
                    }
                    uVar47 = (uint)uVar32;
                    iVar9 = 1;
                    iVar14 = iVar14 + 1;
                    iVar12 = iVar12 + 8;
                  } while (iVar14 != iVar21);
                }
              }
              else {
                iVar9 = 1;
                if (0 < psVar15->img_mcu_y) {
                  iVar43 = 0;
                  do {
                    if (0 < psVar15->img_mcu_x) {
                      local_1a0 = (stbi_uc *)0x0;
                      do {
                        if (0 < psVar15->scan_n) {
                          lVar16 = 0;
                          do {
                            iVar9 = psVar15->order[lVar16];
                            lVar24 = (long)iVar9;
                            paVar22 = (anon_struct_96_18_0d0905d3 *)(lVar24 * 0x60);
                            if (0 < psVar15->img_comp[lVar24].v) {
                              paVar22 = paVar1 + lVar24;
                              iVar21 = 0;
                              bVar49 = true;
                              do {
                                iVar14 = paVar22->h;
                                if (0 < iVar14) {
                                  iVar12 = 0;
                                  do {
                                    iVar42 = paVar22->v;
                                    iVar13 = stbi__jpeg_decode_block
                                                       (psVar15,(short *)&local_f8,
                                                        (stbi__huffman *)
                                                        psVar15->huff_dc[paVar22->hd].fast,
                                                        (stbi__huffman *)
                                                        psVar15->huff_ac[paVar22->ha].fast,
                                                        psVar15->fast_ac[paVar22->ha],iVar9,
                                                        psVar15->dequant[paVar22->tq]);
                                    uVar47 = (uint)extraout_RDX_11;
                                    if (iVar13 == 0) {
                                      uVar32 = extraout_RDX_11;
                                      if (bVar49) goto LAB_00104021;
                                      goto LAB_00103f44;
                                    }
                                    (*psVar15->idct_block_kernel)
                                              (paVar22->data +
                                               (long)((iVar14 * (int)local_1a0 + iVar12) * 8) +
                                               (long)((iVar42 * iVar43 + iVar21) * paVar22->w2 * 8),
                                               paVar22->w2,(short *)&local_f8);
                                    iVar12 = iVar12 + 1;
                                    iVar14 = paVar22->h;
                                    uVar32 = extraout_RDX_12;
                                  } while (iVar12 < iVar14);
                                }
                                iVar21 = iVar21 + 1;
                                bVar49 = iVar21 < paVar22->v;
                              } while (iVar21 < paVar22->v);
                            }
LAB_00103f44:
                            lVar16 = lVar16 + 1;
                          } while (lVar16 < psVar15->scan_n);
                        }
                        uVar47 = (uint)uVar32;
                        iVar21 = psVar15->todo;
                        psVar15->todo = iVar21 + -1;
                        iVar9 = 1;
                        if (iVar21 < 2) {
                          if (psVar15->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar15);
                            uVar47 = extraout_EDX_02;
                          }
                          if ((psVar15->marker & 0xf8) != 0xd0) goto LAB_00104032;
                          psVar15->code_buffer = 0;
                          psVar15->code_bits = 0;
                          psVar15->nomore = 0;
                          psVar15->img_comp[3].dc_pred = 0;
                          psVar15->img_comp[2].dc_pred = 0;
                          psVar15->img_comp[1].dc_pred = 0;
                          psVar15->img_comp[0].dc_pred = 0;
                          psVar15->marker = 0xff;
                          iVar9 = psVar15->restart_interval;
                          uVar32 = 0x7fffffff;
                          if (iVar9 == 0) {
                            iVar9 = 0x7fffffff;
                          }
                          psVar15->todo = iVar9;
                          psVar15->eob_run = 0;
                        }
                        uVar47 = (int)local_1a0 + 1;
                        local_1a0 = (stbi_uc *)(ulong)uVar47;
                      } while ((int)uVar47 < psVar15->img_mcu_x);
                    }
                    uVar47 = (uint)uVar32;
                    iVar9 = 1;
                    iVar43 = iVar43 + 1;
                  } while (iVar43 < psVar15->img_mcu_y);
                }
              }
            }
            else if (iVar43 == 1) {
              local_100 = (long)psVar15->order[0];
              local_12c = psVar15->img_comp[local_100].y + 7 >> 3;
              iVar9 = 1;
              if (0 < local_12c) {
                paVar28 = paVar1 + local_100;
                local_130 = psVar15->img_comp[local_100].x + 7 >> 3;
                iVar9 = 0;
                local_120 = paVar28;
                do {
                  if (0 < local_130) {
                    iVar43 = 0;
                    paVar36 = paVar22;
                    do {
                      piVar48 = local_128;
                      psVar37 = paVar28->coeff + (paVar28->coeff_w * iVar9 + iVar43) * 0x40;
                      uVar31 = (ulong)psVar15->spec_start;
                      if (uVar31 == 0) {
                        iVar21 = stbi__jpeg_decode_block_prog_dc
                                           (psVar15,psVar37,
                                            (stbi__huffman *)psVar15->huff_dc[paVar28->hd].fast,
                                            (int)local_100);
                        uVar32 = extraout_RDX_03;
                        if (iVar21 != 0) goto LAB_0010367f;
                        bVar49 = false;
                        paVar22 = (anon_struct_96_18_0d0905d3 *)0x0;
                      }
                      else {
                        lVar16 = (long)paVar28->ha;
                        local_1a0 = psVar15->huff_ac[lVar16].fast;
                        iVar21 = psVar15->eob_run;
                        bVar8 = (byte)psVar15->succ_low;
                        if (psVar15->succ_high == 0) {
                          if (iVar21 == 0) {
                            do {
                              if (psVar15->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar15);
                              }
                              sVar46 = psVar15->fast_ac[lVar16][psVar15->code_buffer >> 0x17];
                              uVar47 = (uint)sVar46;
                              iVar21 = (int)uVar31;
                              if (sVar46 == 0) {
                                if (psVar15->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar15);
                                }
                                uVar47 = psVar15->code_buffer;
                                uVar17 = (ulong)uVar47;
                                uVar32 = (ulong)local_1a0[uVar47 >> 0x17];
                                if (uVar32 == 0xff) {
                                  lVar24 = 0;
                                  do {
                                    lVar40 = lVar24;
                                    lVar24 = lVar40 + 1;
                                  } while ((uint)piVar48[lVar16 * 0x1a4 + lVar40 + -0x11] <=
                                           uVar47 >> 0x10);
                                  iVar14 = psVar15->code_bits;
                                  if (lVar24 == 8) {
                                    psVar15->code_bits = iVar14 + -0x10;
                                    uVar35 = 0xffffffff;
                                  }
                                  else {
                                    uVar35 = 0xffffffff;
                                    if ((int)(lVar40 + 10) <= iVar14) {
                                      uVar35 = stbi__bmask[lVar40 + 10];
                                      iVar12 = piVar48[lVar16 * 0x1a4 + lVar24];
                                      uVar27 = uVar47 << ((byte)(lVar40 + 10) & 0x1f);
                                      psVar15->code_bits = (iVar14 - (int)lVar24) + -9;
                                      psVar15->code_buffer = uVar27;
                                      uVar32 = (ulong)(int)((uVar47 >> (0x17U - (char)lVar24 & 0x1f)
                                                            & uVar35) + iVar12);
                                      goto LAB_001038b0;
                                    }
                                  }
                                }
                                else {
                                  bVar2 = local_1a0[uVar32 + 0x500];
                                  uVar35 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar15->code_bits) {
                                    uVar27 = uVar47 << (bVar2 & 0x1f);
                                    psVar15->code_buffer = uVar27;
                                    psVar15->code_bits = psVar15->code_bits - (uint)bVar2;
LAB_001038b0:
                                    uVar17 = (ulong)uVar27;
                                    uVar35 = (uint)local_1a0[uVar32 + 0x400];
                                  }
                                }
                                if ((int)uVar35 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar21 = 1;
LAB_00103a05:
                                  uVar32 = 0;
                                }
                                else {
                                  uVar47 = uVar35 >> 4;
                                  uVar27 = uVar35 & 0xf;
                                  if (uVar27 == 0) {
                                    if (uVar35 < 0xf0) {
                                      psVar15->eob_run = 1 << ((byte)uVar47 & 0x1f);
                                      if (0xf < uVar35) {
                                        if (psVar15->code_bits < (int)uVar47) {
                                          stbi__grow_buffer_unsafe(psVar15);
                                        }
                                        bVar2 = (byte)uVar47 & 0x1f;
                                        uVar27 = psVar15->code_buffer << bVar2 |
                                                 psVar15->code_buffer >> 0x20 - bVar2;
                                        uVar35 = stbi__bmask[uVar47];
                                        psVar15->code_buffer = ~uVar35 & uVar27;
                                        psVar15->code_bits = psVar15->code_bits - uVar47;
                                        psVar15->eob_run = psVar15->eob_run + (uVar27 & uVar35);
                                      }
                                      psVar15->eob_run = psVar15->eob_run + -1;
                                      iVar21 = 2;
                                      goto LAB_00103a05;
                                    }
                                    uVar47 = iVar21 + 0x10;
                                    uVar30 = (uint7)(uVar17 >> 8);
                                  }
                                  else {
                                    lVar24 = (long)iVar21 + (ulong)uVar47;
                                    bVar2 = ""[lVar24];
                                    if (psVar15->code_bits < (int)uVar27) {
                                      stbi__grow_buffer_unsafe(psVar15);
                                    }
                                    uVar47 = psVar15->code_buffer;
                                    uVar25 = uVar47 << (sbyte)uVar27 |
                                             uVar47 >> 0x20 - (sbyte)uVar27;
                                    uVar35 = *(uint *)((long)stbi__bmask + (ulong)(uVar27 * 4));
                                    psVar15->code_buffer = ~uVar35 & uVar25;
                                    psVar15->code_bits = psVar15->code_bits - uVar27;
                                    iVar21 = 0;
                                    if (-1 < (int)uVar47) {
                                      iVar21 = *(int *)((long)stbi__jbias + (ulong)(uVar27 * 4));
                                    }
                                    iVar21 = (uVar25 & uVar35) + iVar21 << (bVar8 & 0x1f);
                                    uVar47 = (int)lVar24 + 1;
                                    psVar37[bVar2] = (short)iVar21;
                                    uVar30 = (uint7)(uint3)((uint)iVar21 >> 8);
                                  }
                                  iVar21 = 0;
                                  uVar31 = (ulong)uVar47;
                                  uVar32 = CONCAT71(uVar30,1);
                                }
                              }
                              else {
                                psVar15->code_buffer = psVar15->code_buffer << (sbyte)(uVar47 & 0xf)
                                ;
                                psVar15->code_bits = psVar15->code_bits - (uVar47 & 0xf);
                                lVar24 = (long)iVar21 + (ulong)(uVar47 >> 4 & 0xf);
                                uVar31 = (ulong)((int)lVar24 + 1);
                                psVar37[""[lVar24]] = (short)((uVar47 >> 8) << (bVar8 & 0x1f));
                                iVar21 = 0 << (bVar8 & 0x1f);
                                uVar32 = 1;
                              }
                              paVar22 = (anon_struct_96_18_0d0905d3 *)0x0;
                              uVar17 = 1;
                              if (iVar21 != 0) {
                                if (iVar21 != 2) {
                                  uVar17 = uVar32;
                                }
                                break;
                              }
                            } while ((int)uVar31 <= psVar15->spec_end);
                          }
                          else {
                            psVar15->eob_run = iVar21 + -1;
                            paVar22 = (anon_struct_96_18_0d0905d3 *)0x1;
                            uVar17 = 0;
                          }
                          if ((char)uVar17 != '\0') goto LAB_00103659;
                        }
                        else {
                          if (iVar21 == 0) {
                            uVar47 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                            do {
                              if (psVar15->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar15);
                              }
                              uVar35 = psVar15->code_buffer;
                              uVar32 = (ulong)uVar35;
                              uVar17 = (ulong)local_1a0[uVar35 >> 0x17];
                              if (uVar17 == 0xff) {
                                lVar24 = 0;
                                do {
                                  lVar40 = lVar24;
                                  lVar24 = lVar40 + 1;
                                } while ((uint)piVar48[lVar16 * 0x1a4 + lVar40 + -0x11] <=
                                         uVar35 >> 0x10);
                                iVar21 = psVar15->code_bits;
                                if (lVar24 == 8) {
                                  psVar15->code_bits = iVar21 + -0x10;
                                  uVar27 = 0xffffffff;
                                }
                                else {
                                  uVar27 = 0xffffffff;
                                  if ((int)(lVar40 + 10) <= iVar21) {
                                    uVar27 = stbi__bmask[lVar40 + 10];
                                    iVar14 = piVar48[lVar16 * 0x1a4 + lVar24];
                                    uVar25 = uVar35 << ((byte)(lVar40 + 10) & 0x1f);
                                    psVar15->code_bits = (iVar21 - (int)lVar24) + -9;
                                    psVar15->code_buffer = uVar25;
                                    uVar17 = (ulong)(int)((uVar35 >> (0x17U - (char)lVar24 & 0x1f) &
                                                          uVar27) + iVar14);
                                    goto LAB_0010346f;
                                  }
                                }
                              }
                              else {
                                bVar2 = local_1a0[uVar17 + 0x500];
                                uVar27 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar15->code_bits) {
                                  uVar25 = uVar35 << (bVar2 & 0x1f);
                                  psVar15->code_buffer = uVar25;
                                  psVar15->code_bits = psVar15->code_bits - (uint)bVar2;
LAB_0010346f:
                                  uVar32 = (ulong)uVar25;
                                  uVar27 = (uint)local_1a0[uVar17 + 0x400];
                                }
                              }
                              if ((int)uVar27 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                bVar49 = false;
                              }
                              else {
                                uVar35 = uVar27 >> 4;
                                if ((uVar27 & 0xf) == 1) {
                                  if (psVar15->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar15);
                                    uVar32 = extraout_RDX_04;
                                  }
                                  uVar27 = psVar15->code_buffer;
                                  psVar15->code_buffer = uVar27 * 2;
                                  psVar15->code_bits = psVar15->code_bits + -1;
                                  sVar46 = (short)(((int)~uVar27 >> 0x1f | 1U) << (bVar8 & 0x1f));
                                }
                                else {
                                  if ((uVar27 & 0xf) != 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar49 = false;
                                    goto LAB_00103645;
                                  }
                                  if (uVar27 < 0xf0) {
                                    psVar15->eob_run = ~(-1 << ((byte)uVar35 & 0x1f));
                                    uVar25 = 0x40;
                                    if (0xf < uVar27) {
                                      if (psVar15->code_bits < (int)uVar35) {
                                        stbi__grow_buffer_unsafe(psVar15);
                                      }
                                      bVar2 = (byte)uVar35 & 0x1f;
                                      uVar11 = psVar15->code_buffer << bVar2 |
                                               psVar15->code_buffer >> 0x20 - bVar2;
                                      uVar27 = stbi__bmask[uVar35];
                                      uVar26 = ~uVar27 & uVar11;
                                      uVar32 = (ulong)uVar26;
                                      psVar15->code_buffer = uVar26;
                                      psVar15->code_bits = psVar15->code_bits - uVar35;
                                      psVar15->eob_run = psVar15->eob_run + (uVar11 & uVar27);
                                    }
                                  }
                                  else {
                                    uVar25 = 0xf;
                                  }
                                  uVar35 = uVar25;
                                  sVar46 = 0;
                                }
                                uVar31 = (ulong)(int)uVar31;
                                do {
                                  if ((long)psVar15->spec_end < (long)uVar31) break;
                                  bVar2 = ""[uVar31];
                                  if (psVar37[bVar2] == 0) {
                                    if (uVar35 == 0) {
                                      psVar37[bVar2] = sVar46;
                                      bVar49 = false;
                                      uVar35 = 0;
                                    }
                                    else {
                                      uVar35 = uVar35 - 1;
                                      bVar49 = true;
                                    }
                                  }
                                  else {
                                    if (psVar15->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar15);
                                      uVar32 = extraout_RDX_05;
                                    }
                                    sVar10 = psVar15->code_buffer;
                                    psVar15->code_buffer = sVar10 * 2;
                                    psVar15->code_bits = psVar15->code_bits + -1;
                                    bVar49 = true;
                                    if (((int)sVar10 < 0) &&
                                       (sVar3 = psVar37[bVar2], (uVar47 & (int)sVar3) == 0)) {
                                      uVar27 = uVar47;
                                      if (sVar3 < 1) {
                                        uVar27 = -uVar47;
                                      }
                                      psVar37[bVar2] = sVar3 + (short)uVar27;
                                    }
                                  }
                                  uVar31 = uVar31 + 1;
                                } while (bVar49);
                                bVar49 = true;
                              }
LAB_00103645:
                              if (!bVar49) {
                                paVar22 = (anon_struct_96_18_0d0905d3 *)0x0;
                                goto LAB_0010365e;
                              }
                            } while ((int)uVar31 <= psVar15->spec_end);
                          }
                          else {
                            psVar15->eob_run = iVar21 + -1;
                            if (psVar15->spec_start <= psVar15->spec_end) {
                              uVar47 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                              do {
                                bVar8 = ""[uVar31];
                                if (psVar37[bVar8] != 0) {
                                  if (psVar15->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar15);
                                    uVar32 = extraout_RDX_02;
                                  }
                                  sVar10 = psVar15->code_buffer;
                                  psVar15->code_buffer = sVar10 * 2;
                                  psVar15->code_bits = psVar15->code_bits + -1;
                                  if (((int)sVar10 < 0) &&
                                     (sVar46 = psVar37[bVar8], (uVar47 & (int)sVar46) == 0)) {
                                    uVar35 = -uVar47;
                                    if (0 < sVar46) {
                                      uVar35 = uVar47;
                                    }
                                    psVar37[bVar8] = (short)uVar35 + sVar46;
                                  }
                                }
                                bVar49 = (long)uVar31 < (long)psVar15->spec_end;
                                uVar31 = uVar31 + 1;
                              } while (bVar49);
                            }
                          }
LAB_00103659:
                          paVar22 = (anon_struct_96_18_0d0905d3 *)0x1;
                        }
LAB_0010365e:
                        paVar36 = (anon_struct_96_18_0d0905d3 *)((ulong)paVar36 & 0xffffffff);
                        paVar28 = local_120;
                        if ((int)paVar22 == 0) {
                          bVar49 = false;
                        }
                        else {
LAB_0010367f:
                          paVar22 = paVar36;
                          iVar21 = psVar15->todo;
                          psVar15->todo = iVar21 + -1;
                          bVar49 = true;
                          if (iVar21 < 2) {
                            if (psVar15->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar15);
                              uVar32 = extraout_RDX_06;
                            }
                            if ((psVar15->marker & 0xf8) == 0xd0) {
                              psVar15->code_buffer = 0;
                              psVar15->code_bits = 0;
                              psVar15->nomore = 0;
                              psVar15->img_comp[3].dc_pred = 0;
                              psVar15->img_comp[2].dc_pred = 0;
                              psVar15->img_comp[1].dc_pred = 0;
                              psVar15->img_comp[0].dc_pred = 0;
                              psVar15->marker = 0xff;
                              iVar21 = psVar15->restart_interval;
                              uVar32 = 0x7fffffff;
                              if (iVar21 == 0) {
                                iVar21 = 0x7fffffff;
                              }
                              psVar15->todo = iVar21;
                              psVar15->eob_run = 0;
                            }
                            else {
                              paVar22 = (anon_struct_96_18_0d0905d3 *)0x1;
                              bVar49 = false;
                            }
                          }
                        }
                      }
                      uVar47 = (uint)uVar32;
                      if (!bVar49) {
                        iVar9 = (int)paVar22;
                        goto LAB_00104032;
                      }
                      iVar43 = iVar43 + 1;
                      paVar36 = paVar22;
                    } while (iVar43 != local_130);
                  }
                  uVar47 = (uint)uVar32;
                  iVar9 = iVar9 + 1;
                } while (iVar9 != local_12c);
                iVar9 = 1;
              }
            }
            else {
              iVar9 = 1;
              if (0 < psVar15->img_mcu_y) {
                iVar43 = 0;
                do {
                  if (0 < psVar15->img_mcu_x) {
                    iVar21 = 0;
                    do {
                      if (0 < psVar15->scan_n) {
                        lVar16 = 0;
                        do {
                          iVar9 = psVar15->order[lVar16];
                          lVar24 = (long)iVar9;
                          paVar22 = (anon_struct_96_18_0d0905d3 *)(lVar24 * 0x60);
                          if (0 < psVar15->img_comp[lVar24].v) {
                            paVar22 = paVar1 + lVar24;
                            iVar14 = 0;
                            bVar49 = true;
                            do {
                              iVar12 = paVar22->h;
                              if (0 < iVar12) {
                                iVar42 = 0;
                                do {
                                  iVar12 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar15,paVar22->coeff +
                                                              (iVar12 * iVar21 + iVar42 +
                                                              (paVar22->v * iVar43 + iVar14) *
                                                              paVar22->coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar15->huff_dc[paVar22->hd].fast,iVar9);
                                  uVar47 = (uint)extraout_RDX_10;
                                  uVar32 = extraout_RDX_10;
                                  if (iVar12 == 0) {
                                    if (bVar49) goto LAB_00104021;
                                    goto LAB_00103d1f;
                                  }
                                  iVar42 = iVar42 + 1;
                                  iVar12 = paVar22->h;
                                } while (iVar42 < iVar12);
                              }
                              iVar14 = iVar14 + 1;
                              bVar49 = iVar14 < paVar22->v;
                            } while (iVar14 < paVar22->v);
                          }
LAB_00103d1f:
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < psVar15->scan_n);
                      }
                      uVar47 = (uint)uVar32;
                      iVar14 = psVar15->todo;
                      psVar15->todo = iVar14 + -1;
                      iVar9 = 1;
                      if (iVar14 < 2) {
                        if (psVar15->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar15);
                          uVar47 = extraout_EDX_01;
                        }
                        if ((psVar15->marker & 0xf8) != 0xd0) goto LAB_00104032;
                        psVar15->code_buffer = 0;
                        psVar15->code_bits = 0;
                        psVar15->nomore = 0;
                        psVar15->img_comp[3].dc_pred = 0;
                        psVar15->img_comp[2].dc_pred = 0;
                        psVar15->img_comp[1].dc_pred = 0;
                        psVar15->img_comp[0].dc_pred = 0;
                        psVar15->marker = 0xff;
                        iVar9 = psVar15->restart_interval;
                        uVar32 = 0x7fffffff;
                        if (iVar9 == 0) {
                          iVar9 = 0x7fffffff;
                        }
                        psVar15->todo = iVar9;
                        psVar15->eob_run = 0;
                      }
                      iVar21 = iVar21 + 1;
                    } while (iVar21 < psVar15->img_mcu_x);
                  }
                  uVar47 = (uint)uVar32;
                  iVar9 = 1;
                  iVar43 = iVar43 + 1;
                } while (iVar43 < psVar15->img_mcu_y);
              }
            }
            goto LAB_00104032;
          }
          stbi__g_failure_reason = "bad SOS component count";
LAB_00105392:
          uVar47 = (uint)paVar28;
        }
        else {
          if (bVar8 == 0xdc) {
            iVar9 = stbi__get16be(psVar15->s);
            sVar10 = stbi__get16be(psVar15->s);
            paVar28 = extraout_RDX;
            if (iVar9 == 4) {
              if (sVar10 == psVar15->s->img_y) goto LAB_00104043;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
            goto LAB_00105392;
          }
          if (bVar8 == 0xd9) {
            if ((psVar15->progressive != 0) && (0 < psVar15->s->img_n)) {
              lVar16 = 0;
              do {
                iVar9 = psVar15->img_comp[lVar16].y + 7 >> 3;
                if (0 < iVar9) {
                  uVar47 = paVar1[lVar16].x + 7 >> 3;
                  iVar43 = 0;
                  do {
                    if (0 < (int)uVar47) {
                      uVar32 = 0;
                      do {
                        psVar37 = paVar1[lVar16].coeff +
                                  (paVar1[lVar16].coeff_w * iVar43 + (int)uVar32) * 0x40;
                        iVar21 = paVar1[lVar16].tq;
                        lVar24 = 0;
                        do {
                          psVar37[lVar24] = psVar37[lVar24] * psVar15->dequant[iVar21][lVar24];
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != 0x40);
                        (*psVar15->idct_block_kernel)
                                  (paVar1[lVar16].data +
                                   uVar32 * 8 + (long)(iVar43 * 8 * paVar1[lVar16].w2),
                                   paVar1[lVar16].w2,psVar37);
                        uVar32 = uVar32 + 1;
                      } while (uVar32 != uVar47);
                    }
                    iVar43 = iVar43 + 1;
                  } while (iVar43 != iVar9);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < psVar15->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar15->s->img_n) * 2 + 1;
            }
            uVar47 = psVar15->s->img_n;
            if (uVar47 == 3) {
              bVar49 = true;
              if (psVar15->rgb != 3) {
                if (psVar15->app14_color_transform != 0) goto LAB_00104b9b;
                bVar49 = psVar15->jfif == 0;
              }
            }
            else {
LAB_00104b9b:
              bVar49 = false;
            }
            uVar35 = 1;
            if (bVar49) {
              uVar35 = uVar47;
            }
            if (2 < req_comp) {
              uVar35 = uVar47;
            }
            if (uVar47 != 3) {
              uVar35 = uVar47;
            }
            if ((int)uVar35 < 1) {
LAB_00104d18:
              psVar44 = psVar15->s;
              sVar10 = psVar44->img_y;
              pvVar18 = stbi__malloc_mad3(req_comp,psVar44->img_x,sVar10,1);
              iVar9 = (int)extraout_RDX_13;
              if (pvVar18 == (void *)0x0) {
                stbi__free_jpeg_components(psVar15,psVar44->img_n,iVar9);
                stbi__g_failure_reason = "outofmem";
                pvVar18 = (void *)0x0;
                goto LAB_001053ac;
              }
              if (sVar10 != 0) {
                iVar43 = 0;
                uVar47 = 0;
                psVar29 = extraout_RDX_13;
                do {
                  sVar10 = psVar44->img_x;
                  if (0 < (int)uVar35) {
                    piVar48 = local_d0;
                    uVar32 = 0;
                    piVar45 = &psVar15->img_comp[0].y;
                    do {
                      iVar9 = piVar48[-1];
                      iVar21 = piVar48[-3];
                      iVar14 = iVar21 >> 1;
                      auVar50 = (**(code **)(piVar48 + -10))
                                          (*(stbi_uc **)(piVar45 + 10),
                                           *(undefined8 *)
                                            ((long)piVar48 +
                                            ((ulong)(iVar14 <= iVar9) << 3 | 0xffffffffffffffe0)),
                                           *(undefined8 *)
                                            ((long)piVar48 +
                                            ((ulong)(iVar9 < iVar14) << 3 | 0xffffffffffffffe0)),
                                           piVar48[-2]);
                      psVar29 = auVar50._8_8_;
                      local_158[uVar32] = auVar50._0_8_;
                      piVar48[-1] = iVar9 + 1;
                      if (iVar21 <= iVar9 + 1) {
                        piVar48[-1] = 0;
                        *(long *)(piVar48 + -8) = *(long *)(piVar48 + -6);
                        iVar9 = *piVar48;
                        *piVar48 = iVar9 + 1;
                        if (iVar9 + 1 < *piVar45) {
                          *(long *)(piVar48 + -6) = *(long *)(piVar48 + -6) + (long)piVar45[1];
                        }
                      }
                      uVar32 = uVar32 + 1;
                      piVar45 = piVar45 + 0x18;
                      piVar48 = piVar48 + 0xc;
                    } while (uVar35 != uVar32);
                  }
                  if (req_comp < 3) {
                    psVar44 = psVar15->s;
                    if (bVar49) {
                      if (req_comp == 1) {
                        if (psVar44->img_x != 0) {
                          uVar32 = 0;
                          do {
                            bVar8 = local_158[2][uVar32];
                            *(char *)((long)pvVar18 + uVar32 + sVar10 * iVar43) =
                                 (char)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                        (uint)local_158[1][uVar32] * 0x96 +
                                        (uint)local_158[0][uVar32] * 0x4d >> 8);
                            uVar32 = uVar32 + 1;
                            psVar29 = local_158[1];
                          } while (uVar32 < psVar44->img_x);
                        }
                      }
                      else if (psVar44->img_x != 0) {
                        uVar32 = 0;
                        do {
                          bVar8 = local_158[2][uVar32];
                          *(char *)((long)pvVar18 + uVar32 * 2 + (ulong)(sVar10 * iVar43)) =
                               (char)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                      (uint)local_158[1][uVar32] * 0x96 +
                                      (uint)local_158[0][uVar32] * 0x4d >> 8);
                          *(undefined1 *)((long)pvVar18 + uVar32 * 2 + (ulong)(sVar10 * iVar43) + 1)
                               = 0xff;
                          uVar32 = uVar32 + 1;
                          psVar29 = local_158[1];
                        } while (uVar32 < psVar44->img_x);
                      }
                    }
                    else if (psVar44->img_n == 4) {
                      if (psVar15->app14_color_transform == 2) {
                        if (psVar44->img_x != 0) {
                          puVar33 = (undefined1 *)((long)pvVar18 + (ulong)(sVar10 * iVar43) + 1);
                          uVar32 = 0;
                          do {
                            iVar9 = (local_158[0][uVar32] ^ 0xff) * (uint)local_158[3][uVar32];
                            puVar33[-1] = (char)(iVar9 + (iVar9 + 0x80U >> 8) + 0x80 >> 8);
                            *puVar33 = 0xff;
                            uVar32 = uVar32 + 1;
                            puVar33 = puVar33 + (uint)req_comp;
                            psVar29 = local_158[3];
                          } while (uVar32 < psVar44->img_x);
                        }
                      }
                      else {
                        if (psVar15->app14_color_transform != 0) goto LAB_00105136;
                        if (psVar44->img_x != 0) {
                          puVar33 = (undefined1 *)((long)pvVar18 + (ulong)(sVar10 * iVar43) + 1);
                          uVar32 = 0;
                          do {
                            bVar8 = local_158[3][uVar32];
                            iVar9 = (uint)local_158[0][uVar32] * (uint)bVar8;
                            iVar21 = (uint)local_158[1][uVar32] * (uint)bVar8;
                            puVar33[-1] = (char)(((uint)local_158[2][uVar32] * (uint)bVar8 +
                                                  ((uint)local_158[2][uVar32] * (uint)bVar8 + 0x80
                                                  >> 8) + 0x80 >> 8 & 0xff) * 0x1d +
                                                 ((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8 & 0xff)
                                                 * 0x96 + ((iVar9 + 0x80U >> 8) + iVar9 + 0x80 >> 8
                                                          & 0xff) * 0x4d >> 8);
                            *puVar33 = 0xff;
                            uVar32 = uVar32 + 1;
                            puVar33 = puVar33 + (uint)req_comp;
                            psVar29 = local_158[0];
                          } while (uVar32 < psVar44->img_x);
                        }
                      }
                    }
                    else {
LAB_00105136:
                      if (req_comp == 1) {
                        if (psVar44->img_x != 0) {
                          psVar39 = (stbi_uc *)0x0;
                          do {
                            psVar39[(long)pvVar18 + (ulong)(sVar10 * iVar43)] =
                                 local_158[0][(long)psVar39];
                            psVar39 = psVar39 + 1;
                            psVar29 = (stbi_uc *)(ulong)psVar44->img_x;
                          } while (psVar39 < psVar29);
                        }
                      }
                      else if (psVar44->img_x != 0) {
                        psVar39 = (stbi_uc *)0x0;
                        do {
                          *(stbi_uc *)((long)pvVar18 + (long)psVar39 * 2 + (ulong)(sVar10 * iVar43))
                               = local_158[0][(long)psVar39];
                          *(undefined1 *)
                           ((long)pvVar18 + (long)psVar39 * 2 + (ulong)(sVar10 * iVar43) + 1) = 0xff
                          ;
                          psVar39 = psVar39 + 1;
                          psVar29 = (stbi_uc *)(ulong)psVar44->img_x;
                        } while (psVar39 < psVar29);
                      }
                    }
                  }
                  else {
                    psVar39 = (stbi_uc *)((long)pvVar18 + (ulong)(uVar47 * req_comp * sVar10));
                    psVar44 = psVar15->s;
                    if (psVar44->img_n == 3) {
                      if (bVar49) {
                        if (psVar44->img_x != 0) {
                          puVar33 = (undefined1 *)((long)pvVar18 + (ulong)(sVar10 * iVar43) + 3);
                          uVar32 = 0;
                          do {
                            puVar33[-3] = local_158[0][uVar32];
                            puVar33[-2] = local_158[1][uVar32];
                            puVar33[-1] = local_158[2][uVar32];
                            *puVar33 = 0xff;
                            uVar32 = uVar32 + 1;
                            puVar33 = puVar33 + (uint)req_comp;
                            psVar29 = local_158[2];
                          } while (uVar32 < psVar44->img_x);
                        }
                      }
                      else {
LAB_001051a6:
                        (*psVar15->YCbCr_to_RGB_kernel)
                                  (psVar39,local_158[0],local_158[1],local_158[2],psVar44->img_x,
                                   req_comp);
                        psVar29 = extraout_RDX_14;
                      }
                    }
                    else if (psVar44->img_n == 4) {
                      if (psVar15->app14_color_transform == 2) {
                        (*psVar15->YCbCr_to_RGB_kernel)
                                  (psVar39,local_158[0],local_158[1],local_158[2],psVar44->img_x,
                                   req_comp);
                        psVar44 = psVar15->s;
                        psVar29 = extraout_RDX_15;
                        if (psVar44->img_x != 0) {
                          pbVar34 = (byte *)((long)pvVar18 + (ulong)(sVar10 * iVar43) + 2);
                          psVar29 = (stbi_uc *)0x0;
                          do {
                            bVar8 = local_158[3][(long)psVar29];
                            iVar9 = (pbVar34[-2] ^ 0xff) * (uint)bVar8;
                            pbVar34[-2] = (byte)((iVar9 + 0x80U >> 8) + iVar9 + 0x80 >> 8);
                            iVar9 = (pbVar34[-1] ^ 0xff) * (uint)bVar8;
                            pbVar34[-1] = (byte)(iVar9 + (iVar9 + 0x80U >> 8) + 0x80 >> 8);
                            iVar9 = (*pbVar34 ^ 0xff) * (uint)bVar8;
                            *pbVar34 = (byte)(iVar9 + (iVar9 + 0x80U >> 8) + 0x80 >> 8);
                            psVar29 = psVar29 + 1;
                            pbVar34 = pbVar34 + (uint)req_comp;
                          } while (psVar29 < (stbi_uc *)(ulong)psVar44->img_x);
                        }
                      }
                      else {
                        if (psVar15->app14_color_transform != 0) goto LAB_001051a6;
                        if (psVar44->img_x != 0) {
                          puVar33 = (undefined1 *)((long)pvVar18 + (ulong)(sVar10 * iVar43) + 3);
                          uVar32 = 0;
                          do {
                            bVar8 = local_158[3][uVar32];
                            iVar9 = (uint)local_158[0][uVar32] * (uint)bVar8;
                            puVar33[-3] = (char)((iVar9 + 0x80U >> 8) + iVar9 + 0x80 >> 8);
                            iVar9 = (uint)local_158[1][uVar32] * (uint)bVar8;
                            puVar33[-2] = (char)(iVar9 + (iVar9 + 0x80U >> 8) + 0x80 >> 8);
                            puVar33[-1] = (char)((uint)local_158[2][uVar32] * (uint)bVar8 +
                                                 ((uint)local_158[2][uVar32] * (uint)bVar8 + 0x80 >>
                                                 8) + 0x80 >> 8);
                            *puVar33 = 0xff;
                            uVar32 = uVar32 + 1;
                            puVar33 = puVar33 + (uint)req_comp;
                            psVar29 = local_158[1];
                          } while (uVar32 < psVar44->img_x);
                        }
                      }
                    }
                    else if (psVar44->img_x != 0) {
                      puVar33 = (undefined1 *)((long)pvVar18 + (ulong)(sVar10 * iVar43) + 3);
                      psVar39 = (stbi_uc *)0x0;
                      do {
                        sVar7 = local_158[0][(long)psVar39];
                        puVar33[-1] = sVar7;
                        puVar33[-2] = sVar7;
                        puVar33[-3] = sVar7;
                        *puVar33 = 0xff;
                        psVar39 = psVar39 + 1;
                        psVar29 = (stbi_uc *)(ulong)psVar44->img_x;
                        puVar33 = puVar33 + (uint)req_comp;
                      } while (psVar39 < psVar29);
                    }
                  }
                  iVar9 = (int)psVar29;
                  uVar47 = uVar47 + 1;
                  psVar44 = psVar15->s;
                  iVar43 = iVar43 + req_comp;
                } while (uVar47 < psVar44->img_y);
              }
              stbi__free_jpeg_components(psVar15,psVar44->img_n,iVar9);
              psVar44 = psVar15->s;
              *local_118 = psVar44->img_x;
              *local_110 = psVar44->img_y;
              if (local_108 != (int *)0x0) {
                *local_108 = (uint)(2 < psVar44->img_n) * 2 + 1;
              }
              goto LAB_001053ac;
            }
            lVar16 = 0;
            while( true ) {
              psVar44 = psVar15->s;
              sVar10 = psVar44->img_x;
              pvVar18 = malloc((ulong)(sVar10 + 3));
              *(void **)((long)&psVar15->img_comp[0].linebuf + lVar16 * 2) = pvVar18;
              if (pvVar18 == (void *)0x0) {
                stbi__free_jpeg_components(psVar15,psVar44->img_n,why);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar32 = (long)psVar15->img_h_max /
                         (long)*(int *)((long)&psVar15->img_comp[0].h + lVar16 * 2);
                iVar9 = (int)uVar32;
                *(int *)((long)local_d0 + lVar16 + -0x10) = iVar9;
                iVar43 = psVar15->img_v_max / *(int *)((long)&psVar15->img_comp[0].v + lVar16 * 2);
                *(int *)((long)local_d0 + lVar16 + -0xc) = iVar43;
                *(int *)((long)local_d0 + lVar16 + -4) = iVar43 >> 1;
                *(int *)((long)local_d0 + lVar16 + -8) =
                     (int)((ulong)((iVar9 + sVar10) - 1) / (uVar32 & 0xffffffff));
                *(undefined4 *)((long)local_d0 + lVar16) = 0;
                uVar6 = *(undefined8 *)((long)&psVar15->img_comp[0].data + lVar16 * 2);
                *(undefined8 *)((long)local_d0 + lVar16 + -0x18) = uVar6;
                *(undefined8 *)((long)local_d0 + lVar16 + -0x20) = uVar6;
                if ((iVar9 == 1) && (iVar43 == 1)) {
                  *(code **)((long)&local_f8.s + lVar16) = resample_row_1;
                }
                else {
                  if ((iVar9 == 1) && (iVar43 == 2)) {
                    pcVar19 = stbi__resample_row_v_2;
                  }
                  else if ((iVar9 == 2) && (iVar43 == 1)) {
                    pcVar19 = stbi__resample_row_h_2;
                  }
                  else if ((iVar9 == 2) && (iVar43 == 2)) {
                    pcVar19 = psVar15->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar19 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&local_f8.s + lVar16) = pcVar19;
                }
              }
              if (pvVar18 == (void *)0x0) break;
              lVar16 = lVar16 + 0x30;
              if ((ulong)uVar35 * 0x30 == lVar16) goto LAB_00104d18;
            }
            goto LAB_001053a9;
          }
          iVar9 = stbi__process_marker(psVar15,(uint)bVar8);
          uVar47 = extraout_EDX_00;
          if (iVar9 != 0) goto LAB_00104043;
        }
      }
LAB_00105399:
      stbi__free_jpeg_components(psVar15,psVar15->s->img_n,uVar47);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_001053a9:
    pvVar18 = (void *)0x0;
LAB_001053ac:
    free(psVar15);
    return pvVar18;
  }
  iVar9 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar9 == 0) {
    stbi__g_failure_reason = "unknown image type";
    return (void *)0x0;
  }
  if (4 < (uint)req_comp) {
    stbi__g_failure_reason = "bad req_comp";
    return (void *)0x0;
  }
  local_f8.s = s;
  iVar9 = stbi__parse_png_file(&local_f8,0,req_comp);
  psVar29 = local_f8.out;
  psVar44 = local_f8.s;
  if (iVar9 == 0) {
    psVar29 = (stbi_uc *)0x0;
    goto LAB_00104a1b;
  }
  iVar9 = 8;
  if (8 < local_f8.depth) {
    iVar9 = local_f8.depth;
  }
  ri->bits_per_channel = iVar9;
  local_f8.out = (stbi_uc *)0x0;
  if ((req_comp != 0) && (iVar9 = (local_f8.s)->img_out_n, iVar9 != req_comp)) {
    sVar10 = (local_f8.s)->img_x;
    uVar47 = (local_f8.s)->img_y;
    if (local_f8.depth < 9) {
      psVar39 = (stbi_uc *)stbi__malloc_mad3(req_comp,sVar10,uVar47,0);
      if (psVar39 == (stbi_uc *)0x0) goto LAB_001049be;
      if (0 < (int)uVar47) {
        iVar21 = req_comp + iVar9 * 8;
        iVar43 = sVar10 - 1;
        uVar32 = 0;
        uVar31 = 0;
        uVar17 = 0;
        do {
          if (iVar21 - 10U < 0x1a) {
            iVar14 = sVar10 * (int)uVar17;
            pbVar41 = psVar29 + (uint)(iVar14 * iVar9);
            pbVar34 = psVar39 + (uint)(iVar14 * req_comp);
            switch(iVar21) {
            case 10:
              if (-1 < iVar43) {
                lVar16 = 0;
                sVar20 = sVar10;
                do {
                  psVar39[lVar16 * 2 + uVar31] = psVar29[lVar16 + uVar32];
                  psVar39[lVar16 * 2 + uVar31 + 1] = 0xff;
                  sVar20 = sVar20 - 1;
                  lVar16 = lVar16 + 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0xb:
              if (-1 < iVar43) {
                pbVar34 = psVar39 + uVar31 + 2;
                sVar20 = sVar10;
                do {
                  bVar8 = *pbVar41;
                  *pbVar34 = bVar8;
                  pbVar34[-1] = bVar8;
                  pbVar34[-2] = bVar8;
                  pbVar41 = pbVar41 + 1;
                  sVar20 = sVar20 - 1;
                  pbVar34 = pbVar34 + 3;
                } while (0 < (int)sVar20);
              }
              break;
            case 0xc:
              if (-1 < iVar43) {
                lVar16 = 0;
                sVar20 = sVar10;
                do {
                  sVar7 = psVar29[lVar16 + uVar32];
                  psVar39[lVar16 * 4 + uVar31 + 2] = sVar7;
                  psVar39[lVar16 * 4 + uVar31 + 1] = sVar7;
                  psVar39[lVar16 * 4 + uVar31] = sVar7;
                  psVar39[lVar16 * 4 + uVar31 + 3] = 0xff;
                  sVar20 = sVar20 - 1;
                  lVar16 = lVar16 + 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x11:
              if (-1 < iVar43) {
                lVar16 = 0;
                sVar20 = sVar10;
                do {
                  psVar39[lVar16 + uVar31] = psVar29[lVar16 * 2 + uVar32];
                  sVar20 = sVar20 - 1;
                  lVar16 = lVar16 + 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x13:
              if (-1 < iVar43) {
                pbVar34 = psVar39 + uVar31 + 2;
                sVar20 = sVar10;
                do {
                  bVar8 = *pbVar41;
                  *pbVar34 = bVar8;
                  pbVar34[-1] = bVar8;
                  pbVar34[-2] = bVar8;
                  pbVar41 = pbVar41 + 2;
                  sVar20 = sVar20 - 1;
                  pbVar34 = pbVar34 + 3;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x14:
              if (-1 < iVar43) {
                lVar16 = 0;
                sVar20 = sVar10;
                do {
                  sVar7 = psVar29[lVar16 + uVar32];
                  psVar39[lVar16 * 2 + uVar31 + 2] = sVar7;
                  psVar39[lVar16 * 2 + uVar31 + 1] = sVar7;
                  psVar39[lVar16 * 2 + uVar31] = sVar7;
                  psVar39[lVar16 * 2 + uVar31 + 3] = psVar29[lVar16 + uVar32 + 1];
                  sVar20 = sVar20 - 1;
                  lVar16 = lVar16 + 2;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x19:
              sVar20 = sVar10;
              if (-1 < iVar43) {
                do {
                  bVar8 = pbVar41[2];
                  *pbVar34 = (byte)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                    (uint)pbVar41[1] * 0x96 + (uint)*pbVar41 * 0x4d >> 8);
                  pbVar41 = pbVar41 + 3;
                  pbVar34 = pbVar34 + 1;
                  sVar20 = sVar20 - 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x1a:
              sVar20 = sVar10;
              if (-1 < iVar43) {
                do {
                  bVar8 = pbVar41[2];
                  *pbVar34 = (byte)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                    (uint)pbVar41[1] * 0x96 + (uint)*pbVar41 * 0x4d >> 8);
                  pbVar34[1] = 0xff;
                  pbVar41 = pbVar41 + 3;
                  pbVar34 = pbVar34 + 2;
                  sVar20 = sVar20 - 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x1c:
              sVar20 = sVar10;
              if (-1 < iVar43) {
                do {
                  *pbVar34 = *pbVar41;
                  pbVar34[1] = pbVar41[1];
                  pbVar34[2] = pbVar41[2];
                  pbVar34[3] = 0xff;
                  pbVar41 = pbVar41 + 3;
                  pbVar34 = pbVar34 + 4;
                  sVar20 = sVar20 - 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x21:
              if (-1 < iVar43) {
                lVar16 = 0;
                sVar20 = sVar10;
                do {
                  bVar8 = psVar29[lVar16 * 4 + uVar32 + 2];
                  psVar39[lVar16 + uVar31] =
                       (stbi_uc)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                 (uint)psVar29[lVar16 * 4 + uVar32 + 1] * 0x96 +
                                 (uint)psVar29[lVar16 * 4 + uVar32] * 0x4d >> 8);
                  sVar20 = sVar20 - 1;
                  lVar16 = lVar16 + 1;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x22:
              if (-1 < iVar43) {
                lVar16 = 0;
                sVar20 = sVar10;
                do {
                  bVar8 = psVar29[lVar16 * 2 + uVar32 + 2];
                  psVar39[lVar16 + uVar31] =
                       (stbi_uc)((uint)bVar8 * 2 + ((uint)bVar8 + (uint)bVar8 * 8) * 3 +
                                 (uint)psVar29[lVar16 * 2 + uVar32 + 1] * 0x96 +
                                 (uint)psVar29[lVar16 * 2 + uVar32] * 0x4d >> 8);
                  psVar39[lVar16 + uVar31 + 1] = psVar29[lVar16 * 2 + uVar32 + 3];
                  sVar20 = sVar20 - 1;
                  lVar16 = lVar16 + 2;
                } while (0 < (int)sVar20);
              }
              break;
            case 0x23:
              sVar20 = sVar10;
              if (-1 < iVar43) {
                do {
                  *pbVar34 = *pbVar41;
                  pbVar34[1] = pbVar41[1];
                  pbVar34[2] = pbVar41[2];
                  pbVar41 = pbVar41 + 4;
                  pbVar34 = pbVar34 + 3;
                  sVar20 = sVar20 - 1;
                } while (0 < (int)sVar20);
              }
            }
          }
          uVar17 = uVar17 + 1;
          uVar31 = (ulong)((int)uVar31 + sVar10 * req_comp);
          uVar32 = (ulong)((int)uVar32 + iVar9 * sVar10);
        } while (uVar17 != uVar47);
      }
LAB_001049a3:
      free(psVar29);
    }
    else {
      psVar39 = (stbi_uc *)malloc((ulong)(req_comp * sVar10 * uVar47 * 2));
      if (psVar39 != (stbi_uc *)0x0) {
        if (0 < (int)uVar47) {
          iVar21 = req_comp + iVar9 * 8;
          iVar43 = sVar10 - 1;
          uVar32 = 0;
          uVar31 = 0;
          uVar17 = 0;
          do {
            if (iVar21 - 10U < 0x1a) {
              iVar14 = sVar10 * (int)uVar17;
              puVar38 = (ushort *)(psVar29 + (ulong)(uint)(iVar14 * iVar9) * 2);
              puVar23 = (ushort *)(psVar39 + (ulong)(uint)(iVar14 * req_comp) * 2);
              switch(iVar21) {
              case 10:
                if (-1 < iVar43) {
                  lVar16 = 0;
                  sVar20 = sVar10;
                  do {
                    *(undefined2 *)(psVar39 + lVar16 * 2 + uVar31 * 2) =
                         *(undefined2 *)(psVar29 + lVar16 + uVar32 * 2);
                    (psVar39 + lVar16 * 2 + uVar31 * 2 + 2)[0] = 0xff;
                    (psVar39 + lVar16 * 2 + uVar31 * 2 + 2)[1] = 0xff;
                    sVar20 = sVar20 - 1;
                    lVar16 = lVar16 + 2;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0xb:
                if (-1 < iVar43) {
                  puVar23 = (ushort *)(psVar39 + uVar31 * 2 + 4);
                  sVar20 = sVar10;
                  do {
                    uVar4 = *puVar38;
                    *puVar23 = uVar4;
                    puVar23[-1] = uVar4;
                    puVar23[-2] = uVar4;
                    puVar38 = puVar38 + 1;
                    sVar20 = sVar20 - 1;
                    puVar23 = puVar23 + 3;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0xc:
                if (-1 < iVar43) {
                  lVar16 = 0;
                  sVar20 = sVar10;
                  do {
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = (ulong)*(ushort *)(psVar29 + lVar16 + uVar32 * 2) | 0xffff0000;
                    auVar50 = pshuflw(auVar50,auVar50,0x40);
                    *(long *)(psVar39 + lVar16 * 4 + uVar31 * 2) = auVar50._0_8_;
                    sVar20 = sVar20 - 1;
                    lVar16 = lVar16 + 2;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x11:
                if (-1 < iVar43) {
                  lVar16 = 0;
                  sVar20 = sVar10;
                  do {
                    *(undefined2 *)(psVar39 + lVar16 + uVar31 * 2) =
                         *(undefined2 *)(psVar29 + lVar16 * 2 + uVar32 * 2);
                    sVar20 = sVar20 - 1;
                    lVar16 = lVar16 + 2;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x13:
                if (-1 < iVar43) {
                  puVar23 = (ushort *)(psVar39 + uVar31 * 2 + 4);
                  sVar20 = sVar10;
                  do {
                    uVar4 = *puVar38;
                    *puVar23 = uVar4;
                    puVar23[-1] = uVar4;
                    puVar23[-2] = uVar4;
                    puVar38 = puVar38 + 2;
                    sVar20 = sVar20 - 1;
                    puVar23 = puVar23 + 3;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x14:
                if (-1 < iVar43) {
                  lVar16 = uVar31 * 2;
                  lVar24 = 0;
                  sVar20 = sVar10;
                  do {
                    uVar5 = *(undefined2 *)(psVar29 + lVar24 + uVar32 * 2);
                    *(undefined2 *)(psVar39 + lVar24 * 2 + lVar16 + 4) = uVar5;
                    *(undefined2 *)(psVar39 + lVar24 * 2 + lVar16 + 2) = uVar5;
                    *(undefined2 *)(psVar39 + lVar24 * 2 + lVar16) = uVar5;
                    *(undefined2 *)(psVar39 + lVar24 * 2 + lVar16 + 6) =
                         *(undefined2 *)(psVar29 + lVar24 + uVar32 * 2 + 2);
                    sVar20 = sVar20 - 1;
                    lVar24 = lVar24 + 4;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x19:
                sVar20 = sVar10;
                if (-1 < iVar43) {
                  do {
                    uVar4 = puVar38[2];
                    *puVar23 = (ushort)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                        (uint)puVar38[1] * 0x96 + (uint)*puVar38 * 0x4d >> 8);
                    puVar38 = puVar38 + 3;
                    puVar23 = puVar23 + 1;
                    sVar20 = sVar20 - 1;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x1a:
                sVar20 = sVar10;
                if (-1 < iVar43) {
                  do {
                    uVar4 = puVar38[2];
                    *puVar23 = (ushort)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                        (uint)puVar38[1] * 0x96 + (uint)*puVar38 * 0x4d >> 8);
                    puVar23[1] = 0xffff;
                    puVar38 = puVar38 + 3;
                    puVar23 = puVar23 + 2;
                    sVar20 = sVar20 - 1;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x1c:
                sVar20 = sVar10;
                if (-1 < iVar43) {
                  do {
                    *puVar23 = *puVar38;
                    puVar23[1] = puVar38[1];
                    puVar23[2] = puVar38[2];
                    puVar23[3] = 0xffff;
                    puVar38 = puVar38 + 3;
                    puVar23 = puVar23 + 4;
                    sVar20 = sVar20 - 1;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x21:
                if (-1 < iVar43) {
                  lVar16 = 0;
                  sVar20 = sVar10;
                  do {
                    uVar4 = *(ushort *)(psVar29 + lVar16 * 4 + uVar32 * 2 + 4);
                    *(short *)(psVar39 + lVar16 + uVar31 * 2) =
                         (short)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                 (uint)*(ushort *)(psVar29 + lVar16 * 4 + uVar32 * 2 + 2) * 0x96 +
                                 (uint)*(ushort *)(psVar29 + lVar16 * 4 + uVar32 * 2) * 0x4d >> 8);
                    sVar20 = sVar20 - 1;
                    lVar16 = lVar16 + 2;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x22:
                if (-1 < iVar43) {
                  lVar16 = 0;
                  sVar20 = sVar10;
                  do {
                    uVar4 = *(ushort *)(psVar29 + lVar16 * 2 + uVar32 * 2 + 4);
                    *(short *)(psVar39 + lVar16 + uVar31 * 2) =
                         (short)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                 (uint)*(ushort *)(psVar29 + lVar16 * 2 + uVar32 * 2 + 2) * 0x96 +
                                 (uint)*(ushort *)(psVar29 + lVar16 * 2 + uVar32 * 2) * 0x4d >> 8);
                    *(undefined2 *)(psVar39 + lVar16 + uVar31 * 2 + 2) =
                         *(undefined2 *)(psVar29 + lVar16 * 2 + uVar32 * 2 + 6);
                    sVar20 = sVar20 - 1;
                    lVar16 = lVar16 + 4;
                  } while (0 < (int)sVar20);
                }
                break;
              case 0x23:
                sVar20 = sVar10;
                if (-1 < iVar43) {
                  do {
                    *puVar23 = *puVar38;
                    puVar23[1] = puVar38[1];
                    puVar23[2] = puVar38[2];
                    puVar38 = puVar38 + 4;
                    puVar23 = puVar23 + 3;
                    sVar20 = sVar20 - 1;
                  } while (0 < (int)sVar20);
                }
              }
            }
            uVar17 = uVar17 + 1;
            uVar31 = (ulong)((int)uVar31 + req_comp * sVar10);
            uVar32 = (ulong)((int)uVar32 + iVar9 * sVar10);
          } while (uVar17 != uVar47);
        }
        goto LAB_001049a3;
      }
LAB_001049be:
      free(psVar29);
      stbi__g_failure_reason = "outofmem";
      psVar39 = (stbi_uc *)0x0;
    }
    psVar44->img_out_n = req_comp;
    psVar29 = psVar39;
    if (psVar39 == (stbi_uc *)0x0) {
      return (void *)0x0;
    }
  }
  *local_118 = (local_f8.s)->img_x;
  *local_110 = (local_f8.s)->img_y;
  if (local_108 != (int *)0x0) {
    *local_108 = (local_f8.s)->img_n;
  }
LAB_00104a1b:
  free(local_f8.out);
  local_f8.out = (stbi_uc *)0x0;
  free(local_f8.expanded);
  local_f8.expanded = (stbi_uc *)0x0;
  free(local_f8.idata);
  return psVar29;
LAB_00104021:
  iVar9 = 0;
LAB_00104032:
  if (iVar9 == 0) goto LAB_00105399;
  if (psVar15->marker != 0xff) goto LAB_00104043;
LAB_0010404d:
  do {
    psVar44 = psVar15->s;
    if ((psVar44->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010406d:
      if (psVar44->img_buffer_end <= psVar44->img_buffer) goto LAB_00104043;
    }
    else {
      iVar9 = (*(psVar44->io).eof)(psVar44->io_user_data);
      if (iVar9 != 0) {
        if (psVar44->read_from_callbacks != 0) goto LAB_0010406d;
        goto LAB_00104043;
      }
    }
    psVar44 = psVar15->s;
    psVar29 = psVar44->img_buffer;
    if (psVar44->img_buffer_end <= psVar29) {
      if (psVar44->read_from_callbacks == 0) goto LAB_0010404d;
      psVar29 = psVar44->buffer_start;
      iVar9 = (*(psVar44->io).read)(psVar44->io_user_data,(char *)psVar29,psVar44->buflen);
      if (iVar9 == 0) {
        psVar44->read_from_callbacks = 0;
        psVar44->img_buffer = psVar29;
        psVar44->img_buffer_end = psVar44->buffer_start + 1;
        psVar44->buffer_start[0] = '\0';
      }
      else {
        psVar44->img_buffer = psVar29;
        psVar44->img_buffer_end = psVar29 + iVar9;
      }
      psVar29 = psVar44->img_buffer;
    }
    psVar44->img_buffer = psVar29 + 1;
  } while (*psVar29 != 0xff);
  psVar44 = psVar15->s;
  psVar29 = psVar44->img_buffer;
  if (psVar29 < psVar44->img_buffer_end) {
LAB_00104177:
    psVar44->img_buffer = psVar29 + 1;
    sVar7 = *psVar29;
  }
  else {
    if (psVar44->read_from_callbacks != 0) {
      psVar29 = psVar44->buffer_start;
      iVar9 = (*(psVar44->io).read)(psVar44->io_user_data,(char *)psVar29,psVar44->buflen);
      if (iVar9 == 0) {
        psVar44->read_from_callbacks = 0;
        psVar44->img_buffer = psVar29;
        psVar44->img_buffer_end = psVar44->buffer_start + 1;
        psVar44->buffer_start[0] = '\0';
      }
      else {
        psVar44->img_buffer = psVar29;
        psVar44->img_buffer_end = psVar29 + iVar9;
      }
      psVar29 = psVar44->img_buffer;
      goto LAB_00104177;
    }
    sVar7 = '\0';
  }
  psVar15->marker = sVar7;
LAB_00104043:
  bVar8 = stbi__get_marker(psVar15);
  goto LAB_00102c5e;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int /*bpc*/)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}